

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O0

void __thiscall DROPlayer::DROPlayer(DROPlayer *this)

{
  ulong local_18;
  size_t curDev;
  DROPlayer *this_local;
  
  PlayerBase::PlayerBase(&this->super_PlayerBase);
  (this->super_PlayerBase)._vptr_PlayerBase = (_func_int **)&PTR__DROPlayer_001f3c70;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->_devTypes);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->_devPanning);
  std::vector<_device_generic_config,_std::allocator<_device_generic_config>_>::vector
            (&this->_devCfgs);
  this->_tickFreq = 1000;
  std::vector<bool,_std::allocator<bool>_>::vector(&this->_initRegSet);
  std::vector<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>::vector
            (&this->_devices);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->_devNames);
  this->_filePos = 0;
  this->_fileTick = 0;
  this->_playTick = 0;
  this->_playSmpl = 0;
  this->_playState = '\0';
  this->_psTrigger = '\0';
  ::dev_logger_set(&this->_logger,this,PlayerLogCB,(void *)0x0);
  (this->_playOpts).genOpts.pbSpeed = 0x10000;
  (this->_playOpts).v2opl3Mode = '\0';
  this->_lastTsMult = 0;
  this->_lastTsDiv = 0;
  for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
    PlayerBase::InitDeviceOptions(this->_devOpts + local_18);
  }
  std::vector<bool,_std::allocator<bool>_>::resize(&this->_initRegSet,0x200,false);
  return;
}

Assistant:

DROPlayer::DROPlayer() :
	_tickFreq(1000),
	_filePos(0),
	_fileTick(0),
	_playTick(0),
	_playSmpl(0),
	_playState(0x00),
	_psTrigger(0x00)
{
	size_t curDev;
	
	dev_logger_set(&_logger, this, DROPlayer::PlayerLogCB, NULL);
	
	_playOpts.genOpts.pbSpeed = 0x10000;
	_playOpts.v2opl3Mode = DRO_V2OPL3_DETECT;
	
	_lastTsMult = 0;
	_lastTsDiv = 0;
	
	for (curDev = 0; curDev < 3; curDev ++)
		InitDeviceOptions(_devOpts[curDev]);
	_initRegSet.resize(0x200, false);
}